

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::readTrackEncoding(MatroskaDemuxer *this,MatroskaTrack *track)

{
  int *levelUp;
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t local_24;
  
  iVar1 = ebml_read_master(this,&local_24);
  if (-1 < iVar1) {
    levelUp = &this->level_up;
    iVar1 = 0;
    iVar2 = 0;
    do {
      if (iVar2 != 0) {
        return 0;
      }
      uVar3 = ebml_peek_id(this,levelUp);
      if (uVar3 == 0) {
        return 0;
      }
      iVar4 = *levelUp;
      if (0 < iVar4) break;
      if (uVar3 == 0x5034) {
        iVar2 = readEncodingCompression(this,track);
      }
      else {
        iVar2 = ebml_read_skip(this);
      }
      iVar4 = *levelUp;
    } while (iVar4 == 0);
    *levelUp = iVar4 + -1;
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::readTrackEncoding(MatroskaTrack *track)
{
    int res;
    uint32_t id;

    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            break;
        }
        if (level_up > 0)
        {
            level_up--;
            break;
        }

        res = id == MATROSKA_ID_ENCODINGCOMPRESSION ? readEncodingCompression(track) : ebml_read_skip();

        if (level_up)
        {
            level_up--;
            break;
        }
    }
    return 0;
}